

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O3

town * town_by_name(level_map_conflict *map,char *name)

{
  town *ptVar1;
  int iVar2;
  char *__s2;
  long lVar3;
  long lVar4;
  
  if ((name != (char *)0x0) && (0 < map->num_towns)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      ptVar1 = map->towns;
      __s2 = level_name(map->levels + *(int *)((long)&ptVar1->index + lVar3));
      iVar2 = strcmp(name,__s2);
      if (iVar2 == 0) {
        return (town *)((long)&ptVar1->index + lVar3);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar4 < map->num_towns);
  }
  return (town *)0x0;
}

Assistant:

struct town *town_by_name(struct level_map *map, const char *name)
{
	int i;

	/* No hometown */
	if (!name) return NULL;

	for (i = 0; i < map->num_towns; i++) {
		struct town *town = &map->towns[i];
		struct level *lev = &map->levels[town->index];
		if (streq(name, level_name(lev))) {
			return town;
		}
	}
	return NULL;
}